

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

Psbt * __thiscall cfd::core::Psbt::operator=(Psbt *this,Psbt *psbt)

{
  undefined8 uVar1;
  Transaction *__return_storage_ptr__;
  string *message;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff40;
  undefined1 local_69 [33];
  CfdSourceLocation local_48;
  int local_2c;
  wally_psbt *pwStack_28;
  int ret;
  wally_psbt *psbt_src_pointer;
  wally_psbt *psbt_pointer;
  Psbt *psbt_local;
  Psbt *this_local;
  
  if (this != psbt) {
    psbt_src_pointer = (wally_psbt *)0x0;
    pwStack_28 = (wally_psbt *)psbt->wally_psbt_pointer_;
    psbt_pointer = (wally_psbt *)psbt;
    psbt_local = this;
    local_2c = wally_psbt_clone_alloc(pwStack_28,0,&psbt_src_pointer);
    if (local_2c != 0) {
      local_48.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      error_code = (CfdError)((ulong)this >> 0x20);
      local_48.filename = local_48.filename + 1;
      local_48.line = 0x778;
      local_48.funcname = "operator=";
      logger::warn<int&>(&local_48,"wally_psbt_clone_alloc NG[{}]",&local_2c);
      uVar1 = __cxa_allocate_exception(0x30);
      message = (string *)local_69;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_69 + 1),"psbt clone error.",(allocator *)message);
      CfdException::CfdException(in_stack_ffffffffffffff40,error_code,message);
      __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    FreeWallyPsbtAddress(this->wally_psbt_pointer_);
    this->wally_psbt_pointer_ = psbt_src_pointer;
    __return_storage_ptr__ = (Transaction *)&stack0xffffffffffffff40;
    RebuildTransaction(__return_storage_ptr__,this->wally_psbt_pointer_);
    Transaction::operator=(&this->base_tx_,__return_storage_ptr__);
    Transaction::~Transaction(__return_storage_ptr__);
  }
  return this;
}

Assistant:

Psbt &Psbt::operator=(const Psbt &psbt) & {
  if (this != &psbt) {
    struct wally_psbt *psbt_pointer = nullptr;
    struct wally_psbt *psbt_src_pointer = nullptr;
    psbt_src_pointer =
        static_cast<struct wally_psbt *>(psbt.wally_psbt_pointer_);
    int ret = wally_psbt_clone_alloc(psbt_src_pointer, 0, &psbt_pointer);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_clone_alloc NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt clone error.");
    }
    FreeWallyPsbtAddress(wally_psbt_pointer_);  // free
    wally_psbt_pointer_ = psbt_pointer;
    base_tx_ = RebuildTransaction(wally_psbt_pointer_);
  }
  return *this;
}